

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManReverseLevel(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  int local_24;
  int LevelR;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLevelRev;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  local_24 = p->nObjs;
  while( true ) {
    local_24 = local_24 + -1;
    bVar3 = false;
    if (0 < local_24) {
      _LevelR = Gia_ManObj(p,local_24);
      bVar3 = _LevelR != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_LevelR);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(p_00,local_24);
      iVar2 = Gia_ObjIsMux(p,_LevelR);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsXor(_LevelR);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsBuf(_LevelR);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjFaninId0(_LevelR,local_24);
            Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 1);
            iVar2 = Gia_ObjFaninId1(_LevelR,local_24);
            Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 1);
          }
          else {
            iVar2 = Gia_ObjFaninId0(_LevelR,local_24);
            Vec_IntUpdateEntry(p_00,iVar2,iVar1);
          }
        }
        else {
          iVar2 = Gia_ObjFaninId0(_LevelR,local_24);
          Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 2);
          iVar2 = Gia_ObjFaninId1(_LevelR,local_24);
          Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 2);
        }
      }
      else {
        iVar2 = Gia_ObjFaninId0(_LevelR,local_24);
        Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 2);
        iVar2 = Gia_ObjFaninId1(_LevelR,local_24);
        Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 2);
        iVar2 = Gia_ObjFaninId2(p,local_24);
        Vec_IntUpdateEntry(p_00,iVar2,iVar1 + 2);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManReverseLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vLevelRev;
    Gia_Obj_t * pObj;
    int i;
    vLevelRev = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndReverse( p, pObj, i )
    {
        int LevelR = Vec_IntEntry( vLevelRev, i );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId2(p, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsXor(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsBuf(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR );
        }
        else
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 1 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 1 );
        }
    }
    return vLevelRev;
}